

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<7UL>
mserialize::cx_strcat<1ul,1ul,1ul,1ul,2ul,1ul>
          (cx_string<1UL> *strings,cx_string<1UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<1UL> *strings_3,cx_string<2UL> *strings_4,cx_string<1UL> *strings_5)

{
  cx_string<7UL> cVar1;
  cx_string<1UL> *in_RCX;
  cx_string<1UL> *in_RDX;
  cx_string<1UL> *in_RSI;
  cx_string<1UL> *in_RDI;
  cx_string<2UL> *in_R8;
  cx_string<1UL> *in_R9;
  size_t s;
  size_t i;
  char *out;
  size_t size [7];
  char *data [7];
  char buffer [8];
  ulong local_d0;
  ulong local_c8;
  char *local_c0;
  size_t local_b0 [7];
  char *local_78;
  data_ref local_70 [4];
  data_ref local_50;
  data_ref local_48;
  char local_40 [8];
  cx_string<1UL> *local_38;
  cx_string<2UL> *local_30;
  cx_string<1UL> *local_28;
  cx_string<1UL> *local_20;
  cx_string<1UL> *local_18;
  cx_string<1UL> *local_10;
  cx_string<7UL> local_8;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_40,0,8);
  local_78 = "";
  local_70[0] = cx_string<1UL>::data(local_10);
  local_70[1] = cx_string<1UL>::data(local_18);
  local_70[2] = cx_string<1UL>::data(local_20);
  local_70[3] = cx_string<1UL>::data(local_28);
  local_50 = cx_string<2UL>::data(local_30);
  local_48 = cx_string<1UL>::data(local_38);
  local_b0[0] = cx_string<1UL>::size(local_10);
  local_b0[1] = cx_string<1UL>::size(local_18);
  local_b0[2] = cx_string<1UL>::size(local_20);
  local_b0[3] = cx_string<1UL>::size(local_28);
  local_b0[4] = cx_string<2UL>::size(local_30);
  local_b0[5] = cx_string<1UL>::size(local_38);
  local_c0 = local_40;
  for (local_c8 = 1; local_c8 < 7; local_c8 = local_c8 + 1) {
    for (local_d0 = 0; local_d0 < local_b0[local_c8 - 1]; local_d0 = local_d0 + 1) {
      *local_c0 = (*local_70[local_c8 - 1])[local_d0];
      local_c0 = local_c0 + 1;
    }
  }
  cx_string<7UL>::cx_string(&local_8,local_40);
  cVar1._data[0] = local_8._data[0];
  cVar1._data[1] = local_8._data[1];
  cVar1._data[2] = local_8._data[2];
  cVar1._data[3] = local_8._data[3];
  cVar1._data[4] = local_8._data[4];
  cVar1._data[5] = local_8._data[5];
  cVar1._data[6] = local_8._data[6];
  cVar1._data[7] = local_8._data[7];
  return (cx_string<7UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}